

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::SetGroupBitField
          (GroupAssignmentRecord *this,KUINT8 Group,KBOOL InGroup)

{
  KException *this_00;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  KString local_40;
  
  if (Group < 0x20) {
    return;
  }
  this_00 = (KException *)
            __cxa_allocate_exception
                      (0x30,CONCAT71(in_register_00000031,Group),
                       CONCAT71(in_register_00000011,InGroup));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetGroupBitField","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GroupAssignmentRecord::SetGroupBitField(KUINT8 Group, KBOOL InGroup /*= true*/ ) noexcept(false)
{
    if( Group > 31 )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    bitset<32> bits( ( KINT32 )m_ui32GrpBtField ); // We need to cast to a signed int, this is a visual studio 2010 fix
    InGroup ? bits.set( Group ) : bits.reset( Group );
}